

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O3

bool __thiscall xLearn::Checker::check_train_options(Checker *this,HyperParam *hyper_param)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  Checker *this_00;
  string *psVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  double dVar15;
  Modifier reset;
  string similar_str;
  StringList list;
  StrSimilar ss;
  Modifier red;
  Modifier local_ec;
  string local_e8;
  Modifier local_c4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  StrSimilar local_a1;
  string local_a0;
  string *local_80;
  Checker *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  bVar3 = FileExist((this->args_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
  if (!bVar3) {
    StringPrintf_abi_cxx11_
              (&local_e8,"Training data file: %s does not exist.",
               (this->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    local_c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
    local_ec.code = RESET;
    local_a0._M_dataplus._M_p._0_4_ = 0x1f;
    poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
    poVar8 = Color::operator<<(poVar8,(Modifier *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    poVar8 = Color::operator<<(poVar8,&local_ec);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    return false;
  }
  pbVar1 = (this->args_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  std::__cxx11::string::operator=((string *)&hyper_param->train_set_file,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c0,
             (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,
             (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_e8);
  this_00 = (Checker *)
            CONCAT44(local_c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if ((Checker *)
      local_c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != this_00) {
    local_68 = (string *)&hyper_param->log_file;
    local_60 = (string *)&hyper_param->txt_model_file;
    local_70 = (string *)&hyper_param->pre_model_file;
    bVar3 = true;
    uVar12 = 0;
    local_50 = (string *)&hyper_param->model_file;
    local_58 = (string *)&hyper_param->validate_set_file;
    local_48 = (string *)&hyper_param->opt_type;
    local_38 = (string *)&hyper_param->metric;
    local_80 = &hyper_param->loss_func;
    local_40 = &hyper_param->score_func;
    local_78 = this;
    do {
      lVar13 = uVar12 * 0x20;
      iVar5 = std::__cxx11::string::compare((char *)((long)&this_00->menu_ + lVar13));
      if (iVar5 == 0) {
        uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_c0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x20 +
                               uVar12 * 0x20));
        if (5 < uVar6) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,
                     "-s can only be [0 - 5] : \n  for classification task: \n    0 -- linear model (GLM) \n    1 -- factorization machines (FM) \n    2 -- field-aware factorization machines (FFM) \n  for regression task: \n    3 -- linear model (GLM) \n    4 -- factorization machines (FM) \n    5 -- field-aware factorization machines (FFM)"
                     ,"");
          local_a0._M_dataplus._M_p._0_4_ = 0x1f;
          local_ec.code = BOLD;
          local_c4.code = RESET;
          poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
          poVar8 = Color::operator<<(poVar8,&local_ec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
          poVar8 = Color::operator<<(poVar8,&local_c4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          goto LAB_00133858;
        }
        pcVar10 = (char *)(hyper_param->loss_func)._M_string_length;
        pcVar7 = "cross-entropy";
        pcVar9 = "cross-entropy";
        switch(uVar6) {
        case 0:
          pcVar7 = "cross-entropy";
          goto LAB_00133d09;
        case 3:
          pcVar7 = "squared";
LAB_00133d09:
          std::__cxx11::string::_M_replace((ulong)local_80,0,pcVar10,(ulong)pcVar7);
          pcVar10 = "linear";
          break;
        case 4:
          pcVar9 = "squared";
        case 1:
          std::__cxx11::string::_M_replace((ulong)local_80,0,pcVar10,(ulong)pcVar9);
          pcVar10 = "fm";
          break;
        case 5:
          pcVar7 = "squared";
        case 2:
          std::__cxx11::string::_M_replace((ulong)local_80,0,pcVar10,(ulong)pcVar7);
          pcVar10 = "ffm";
        }
        iVar5 = 2;
        std::__cxx11::string::_M_replace
                  ((ulong)local_40,0,(char *)(hyper_param->score_func)._M_string_length,
                   (ulong)pcVar10);
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)(CONCAT44(local_c0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_c0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   lVar13));
        if (iVar5 == 0) {
          lVar13 = (uVar12 + 1) * 0x20;
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          psVar11 = local_38;
          if ((((((iVar5 != 0) &&
                 (iVar5 = std::__cxx11::string::compare
                                    ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar13)), psVar11 = local_38, iVar5 != 0)) &&
                (iVar5 = std::__cxx11::string::compare
                                   ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                            lVar13)), psVar11 = local_38, iVar5 != 0)) &&
               (((iVar5 = std::__cxx11::string::compare
                                    ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar13)), psVar11 = local_38, iVar5 != 0 &&
                 (iVar5 = std::__cxx11::string::compare
                                    ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar13)), psVar11 = local_38, iVar5 != 0)) &&
                ((iVar5 = std::__cxx11::string::compare
                                    ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar13)), psVar11 = local_38, iVar5 != 0 &&
                 ((iVar5 = std::__cxx11::string::compare
                                     ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                              lVar13)), psVar11 = local_38, iVar5 != 0 &&
                  (iVar5 = std::__cxx11::string::compare
                                     ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                              lVar13)), psVar11 = local_38, iVar5 != 0)))))))) &&
              (iVar5 = std::__cxx11::string::compare
                                 ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                          lVar13)), psVar11 = local_38, iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13)), psVar11 = local_38, iVar5 != 0)) {
            StringPrintf_abi_cxx11_
                      (&local_e8,
                       "Unknow metric: %s \n -x can only be: \n   acc \n   prec \n   recall \n   f1 \n   auc\n   mae \n   mape \n   rmsd \n   rmse \n   none"
                       ,*(undefined8 *)
                         (CONCAT44(local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13));
            local_a0._M_dataplus._M_p._0_4_ = 0x1f;
            local_ec.code = BOLD;
            local_c4.code = RESET;
            poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
            poVar8 = Color::operator<<(poVar8,&local_ec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
            poVar8 = Color::operator<<(poVar8,&local_c4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            goto LAB_00133858;
          }
LAB_00133d7f:
          iVar5 = 2;
          std::__cxx11::string::_M_assign(psVar11);
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          if (iVar5 == 0) {
            lVar13 = (uVar12 + 1) * 0x20;
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            psVar11 = local_48;
            if (((iVar5 != 0) &&
                (iVar5 = std::__cxx11::string::compare
                                   ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                            lVar13)), psVar11 = local_48, iVar5 != 0)) &&
               (iVar5 = std::__cxx11::string::compare
                                  ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                           lVar13)), psVar11 = local_48, iVar5 != 0)) {
              StringPrintf_abi_cxx11_
                        (&local_e8,
                         "Unknow optimization method: %s \n -o can only be: adagrad and ftrl. \n",
                         *(undefined8 *)
                          (CONCAT44(local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13));
              local_a0._M_dataplus._M_p._0_4_ = 0x1f;
              local_ec.code = BOLD;
              local_c4.code = RESET;
              poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
              poVar8 = Color::operator<<(poVar8,&local_ec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
              poVar8 = Color::operator<<(poVar8,&local_c4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_00133858;
            }
            goto LAB_00133d7f;
          }
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          if (iVar5 == 0) {
            lVar13 = (uVar12 + 1) * 0x20;
            bVar4 = FileExist(*(char **)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        lVar13));
            psVar11 = local_58;
            if (!bVar4) {
              StringPrintf_abi_cxx11_
                        (&local_e8,"Validation set file: %s dose not exists.",
                         *(undefined8 *)
                          (CONCAT44(local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13));
              local_a0._M_dataplus._M_p._0_4_ = 0x1f;
              local_ec.code = BOLD;
              local_c4.code = RESET;
              poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
              poVar8 = Color::operator<<(poVar8,&local_ec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
              poVar8 = Color::operator<<(poVar8,&local_c4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_00133858;
            }
            goto LAB_00133d7f;
          }
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          psVar11 = local_50;
          if (iVar5 == 0) goto LAB_00133d7f;
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          psVar11 = local_60;
          if (iVar5 == 0) goto LAB_00133d7f;
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          psVar11 = local_68;
          if (iVar5 == 0) goto LAB_00133d7f;
          iVar5 = std::__cxx11::string::compare
                            ((char *)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar13));
          if (iVar5 == 0) {
            uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_c0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x20
                                   + uVar12 * 0x20));
            if (0 < (int)uVar6) {
              hyper_param->num_K = uVar6;
              goto LAB_00134266;
            }
            StringPrintf_abi_cxx11_
                      (&local_e8,"Illegal -k \'%i\'. -k must be geater than zero.",(ulong)uVar6);
            local_a0._M_dataplus._M_p._0_4_ = 0x1f;
            local_ec.code = BOLD;
            local_c4.code = RESET;
            poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
            poVar8 = Color::operator<<(poVar8,&local_ec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
            poVar8 = Color::operator<<(poVar8,&local_c4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
LAB_00133858:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            iVar5 = 2;
            bVar3 = false;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       0x20 + uVar12 * 0x20));
              fVar14 = (float)dVar15;
              if (0.0 < fVar14) {
                hyper_param->learning_rate = fVar14;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -r : \'%f\'. -r must be greater than zero.",
                         (double)fVar14);
              local_a0._M_dataplus._M_p._0_4_ = 0x1f;
              local_ec.code = BOLD;
              local_c4.code = RESET;
              poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
              poVar8 = Color::operator<<(poVar8,&local_ec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
              poVar8 = Color::operator<<(poVar8,&local_c4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       0x20 + uVar12 * 0x20));
              fVar14 = (float)dVar15;
              if (0.0 <= fVar14) {
                hyper_param->regu_lambda = fVar14;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -b : \'%f\' -b must be greater than or equal to zero.",
                         (double)fVar14);
              local_a0._M_dataplus._M_p._0_4_ = 0x1f;
              local_ec.code = BOLD;
              local_c4.code = RESET;
              poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
              poVar8 = Color::operator<<(poVar8,&local_ec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
              poVar8 = Color::operator<<(poVar8,&local_c4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_c0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       0x20 + uVar12 * 0x20));
              fVar14 = (float)dVar15;
              if (0.0 < fVar14) {
                hyper_param->model_scale = fVar14;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -u : \'%f\'. -u must be greater than zero.",
                         (double)fVar14);
              local_a0._M_dataplus._M_p._0_4_ = 0x1f;
              local_ec.code = BOLD;
              local_c4.code = RESET;
              poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_a0);
              poVar8 = Color::operator<<(poVar8,&local_ec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ERROR      ] ",0xf);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
              poVar8 = Color::operator<<(poVar8,&local_c4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (-1 < (int)uVar6) {
                hyper_param->num_epoch = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -e : \'%i\'. -e must be greater than zero.",(ulong)uVar6
                        );
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (-1 < (int)uVar6) {
                hyper_param->num_folds = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -f : \'%i\'. -f must be greater than zero.",(ulong)uVar6
                        );
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            psVar11 = local_70;
            if (iVar5 == 0) goto LAB_00133d7f;
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (0 < (int)uVar6) {
                hyper_param->thread_number = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -nthread : \'%i\'. -nthread must be greater than zero.",
                         (ulong)uVar6);
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (0 < (int)uVar6) {
                hyper_param->block_size = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -block : \'%i\'. -block must be greater than zero.",
                         (ulong)uVar6);
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (0 < (int)uVar6) {
                hyper_param->stop_window = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,"Illegal -sw : \'%i\'. -sw must be greater than or equal to 1.",
                         (ulong)uVar6);
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 == 0) {
              uVar6 = atoi(*(char **)(CONCAT44(local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_c0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      0x20 + uVar12 * 0x20));
              if (0 < (int)uVar6) {
                hyper_param->seed = uVar6;
                goto LAB_00134266;
              }
              StringPrintf_abi_cxx11_
                        (&local_e8,
                         "Illegal -seed : \'%i\'. -seed must be greater than or equal to 1.",
                         (ulong)uVar6);
              Color::print_error(&local_e8);
              goto LAB_00133858;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)(CONCAT44(local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_c0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       lVar13));
            if (iVar5 != 0) {
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->cross_validation = true;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->lock_free = false;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->early_stop = false;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->norm = false;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->bin_out = false;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                hyper_param->quiet = true;
                goto LAB_00134317;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         0x20 + uVar12 * 0x20));
                fVar14 = (float)dVar15;
                if (0.0 < fVar14) {
                  hyper_param->alpha = fVar14;
                  goto LAB_00134266;
                }
                StringPrintf_abi_cxx11_
                          (&local_e8,"Illegal -alpha : \'%f\'. -alpha must be greater than zero.",
                           (double)fVar14);
                Color::print_error(&local_e8);
                goto LAB_00133858;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         0x20 + uVar12 * 0x20));
                fVar14 = (float)dVar15;
                if (0.0 <= fVar14) {
                  hyper_param->beta = fVar14;
                  goto LAB_00134266;
                }
                StringPrintf_abi_cxx11_
                          (&local_e8,"Illegal -beta : \'%f\'. -beta cannot be less than zero.",
                           (double)fVar14);
                Color::print_error(&local_e8);
                goto LAB_00133858;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         0x20 + uVar12 * 0x20));
                fVar14 = (float)dVar15;
                if (fVar14 < 0.0) {
                  StringPrintf_abi_cxx11_
                            (&local_e8,
                             "Illegal -lambda_1 : \'%f\'. -lambda_1 cannot be less than zero.",
                             (double)fVar14);
                  Color::print_error(&local_e8);
                  goto LAB_00133858;
                }
                hyper_param->lambda_1 = fVar14;
LAB_00134266:
                iVar5 = 2;
                goto LAB_00133d8d;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         lVar13));
              if (iVar5 == 0) {
                dVar15 = atof(*(char **)(CONCAT44(local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_c0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         0x20 + uVar12 * 0x20));
                fVar14 = (float)dVar15;
                if (0.0 <= fVar14) {
                  hyper_param->lambda_2 = fVar14;
                  goto LAB_00134266;
                }
                StringPrintf_abi_cxx11_
                          (&local_e8,
                           "Illegal -lambda_2 : \'%f\'. -lambda_2 cannot be less than zero.",
                           (double)fVar14);
                Color::print_error(&local_e8);
                goto LAB_00133858;
              }
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_local_buf[0] = '\0';
              StrSimilar::FindSimilar
                        (&local_a1,
                         (string *)
                         (CONCAT44(local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13),
                         &local_78->menu_,&local_e8);
              StringPrintf_abi_cxx11_
                        (&local_a0,"Unknow argument \'%s\'. Do you mean \'%s\' ?",
                         *(undefined8 *)
                          (CONCAT44(local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13),
                         local_e8._M_dataplus._M_p);
              Color::print_error(&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,local_a0._M_dataplus._M_p._0_4_) !=
                  &local_a0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                         local_a0._M_dataplus._M_p._0_4_));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              goto LAB_00134635;
            }
            hyper_param->on_disk = true;
LAB_00134317:
            iVar5 = 1;
          }
        }
      }
LAB_00133d8d:
      this_00 = (Checker *)
                CONCAT44(local_c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      uVar12 = (ulong)(uint)((int)uVar12 + iVar5);
    } while (uVar12 < (ulong)((long)local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 5)
            );
    if (!bVar3) {
LAB_00134635:
      bVar3 = false;
      goto LAB_00134637;
    }
  }
  check_conflict_train(this_00,hyper_param);
  if (((hyper_param->model_file)._M_string_length == 0) && (hyper_param->cross_validation == false))
  {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar2 = (hyper_param->train_set_file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + (hyper_param->train_set_file)._M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&hyper_param->metric);
  bVar3 = true;
  if (iVar5 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&hyper_param->metric,0,(char *)(hyper_param->metric)._M_string_length,0x1591da
              );
  }
LAB_00134637:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  return bVar3;
}

Assistant:

bool Checker::check_train_options(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check the file path of the training data             *
   *********************************************************/
  if (FileExist(args_[1].c_str())) {
    hyper_param.train_set_file = std::string(args_[1]);
  } else {
    Color::print_error(
      StringPrintf("Training data file: %s does not exist.", 
                    args_[1].c_str())
    );
    return false;
  }
  /*********************************************************
   *  Check each input argument                            *
   *********************************************************/
  StringList list(args_.begin()+2, args_.end());
  StrSimilar ss;
  for (int i = 0; i < list.size(); ) {
    if (list[i].compare("-s") == 0) {  // task type
      int value = atoi(list[i+1].c_str());
      if (value < 0 || value > 5) {
        Color::print_error(
            "-s can only be [0 - 5] : \n"
            "  for classification task: \n"
            "    0 -- linear model (GLM) \n"
            "    1 -- factorization machines (FM) \n"
            "    2 -- field-aware factorization machines (FFM) \n"
            "  for regression task: \n"
            "    3 -- linear model (GLM) \n"
            "    4 -- factorization machines (FM) \n"
            "    5 -- field-aware factorization machines (FFM)");
        bo = false;
      } else {
        switch (value) {
          case 0:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "linear";
            break;
          case 1:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "fm";
            break;
          case 2:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "ffm";
            break;
          case 3:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "linear";
            break;
          case 4:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "fm";
            break;
          case 5:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "ffm";
            break;
          default: break;
        }
      }
      i += 2;
    } else if (list[i].compare("-x") == 0) {  // metrics
      if (list[i+1].compare("acc") != 0 &&
          list[i+1].compare("prec") != 0 &&
          list[i+1].compare("recall") != 0 &&
          list[i+1].compare("f1") != 0 &&
          list[i+1].compare("auc") != 0 &&
          list[i+1].compare("mae") != 0 &&
          list[i+1].compare("mape") != 0 &&
          list[i+1].compare("rmsd") != 0 &&
          list[i+1].compare("rmse") != 0 &&
          list[i+1].compare("none") != 0) {
        Color::print_error(
          StringPrintf("Unknow metric: %s \n"
               " -x can only be: \n"
               "   acc \n"
               "   prec \n" 
               "   recall \n"
               "   f1 \n"
               "   auc\n"
               "   mae \n"
               "   mape \n"
               "   rmsd \n"
               "   rmse \n"
               "   none",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.metric = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-p") == 0) {  // optimization method
      if (list[i+1].compare("adagrad") != 0 &&
          list[i+1].compare("ftrl") != 0 &&
          list[i+1].compare("sgd") != 0) {
        Color::print_error(
          StringPrintf("Unknow optimization method: %s \n"
               " -o can only be: adagrad and ftrl. \n",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.opt_type = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-v") == 0) {  // validation file
      if (FileExist(list[i+1].c_str())) {
        hyper_param.validate_set_file = list[i+1];
      } else {
        Color::print_error(
          StringPrintf("Validation set file: %s dose not exists.",
                       list[i+1].c_str())
        );
        bo = false;
      }
      i += 2;
    } else if (list[i].compare("-m") == 0) {  // model file
      hyper_param.model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-t") == 0) { // txt model file
      hyper_param.txt_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-l") == 0) {  // log file
      hyper_param.log_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-k") == 0) {  // latent factor
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -k '%i'. -k must be geater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_K = value;
      }
      i += 2;
    } else if (list[i].compare("-r") == 0) {  // learning rate
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -r : '%f'. -r must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.learning_rate = value;
      }
      i += 2;
    } else if (list[i].compare("-b") == 0) {  // regular lambda
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -b : '%f' "
               "-b must be greater than or equal to zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.regu_lambda = value;
      }
      i += 2;
    } else if (list[i].compare("-u") == 0) {  // model scale
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -u : '%f'. -u must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.model_scale = value;
      }
      i += 2;
    } else if (list[i].compare("-e") == 0) {  // number of epoch
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -e : '%i'. -e must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_epoch = value;
      }
      i += 2;
    } else if (list[i].compare("-f") == 0) {  // number of folds
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -f : '%i'. -f must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_folds = value;
      }
      i += 2;
    } else if (list[i].compare("-pre") == 0) {  // pre-trained model
      hyper_param.pre_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-nthread") == 0) {  // number of thread
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -nthread : '%i'. -nthread must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.thread_number = value;
      }
      i += 2;
    } else if (list[i].compare("-block") == 0) {  // block size for on-disk training
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -block : '%i'. -block must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.block_size = value;
      }
      i += 2;
    } else if (list[i].compare("-sw") == 0) {  // window size for early stopping
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -sw : '%i'. -sw must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.stop_window = value;
      }
      i += 2;
    } else if (list[i].compare("-seed") == 0) {  // random seed
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -seed : '%i'. -seed must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.seed = value;
      }
      i += 2;
    } else if (list[i].compare("--disk") == 0) {  // on-disk training
      hyper_param.on_disk = true;
      i += 1;
    } else if (list[i].compare("--cv") == 0) {  // cross-validation
      hyper_param.cross_validation = true;
      i += 1;
    } else if (list[i].compare("--dis-lock-free") == 0) {  // lock-free training
      hyper_param.lock_free = false;
      i += 1;
    } else if (list[i].compare("--dis-es") == 0) {  // disable early-stop
      hyper_param.early_stop = false;
      i += 1;
    } else if (list[i].compare("--no-norm") == 0) {  // normalization
      hyper_param.norm = false;
      i += 1;
    } else if (list[i].compare("--no-bin") == 0) {  // do not generate bin file
      hyper_param.bin_out = false;
      i += 1;
    } else if (list[i].compare("--quiet") == 0) {  // quiet
      hyper_param.quiet = true;
      i += 1;
    } else if (list[i].compare("-alpha") == 0) {  // alpha
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -alpha : '%f'. "
                       "-alpha must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.alpha = value;
      }
      i += 2;
    } else if (list[i].compare("-beta") == 0) {  // beta
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -beta : '%f'. "
                       "-beta cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.beta = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_1") == 0) {  // lambda_1
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_1 : '%f'. "
                       "-lambda_1 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_1 = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_2") == 0) { // lambda_2
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_2 : '%f'. "
                       "-lambda_2 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_2 = value;
      }
      i += 2;
    } else {  // no match
      std::string similar_str;
      ss.FindSimilar(list[i], menu_, similar_str);
      Color::print_error(
        StringPrintf("Unknow argument '%s'. Do you mean '%s' ?",
             list[i].c_str(),
             similar_str.c_str())
      );
      bo = false;
      break;
    }
  }
  if (!bo) { return false; }
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}